

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::match(OurReader *this,Location pattern,int patternLength)

{
  Location pCVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pCVar1 = this->current_;
  lVar4 = (long)patternLength;
  lVar5 = lVar4;
  if (lVar4 <= (long)this->end_ - (long)pCVar1) {
    do {
      if (lVar5 == 0) {
        this->current_ = pCVar1 + lVar4;
        return true;
      }
      lVar2 = lVar5 + -1;
      lVar3 = lVar5 + -1;
      lVar5 = lVar5 + -1;
    } while (pCVar1[lVar2] == pattern[lVar3]);
  }
  return false;
}

Assistant:

bool OurReader::match(Location pattern, int patternLength) {
  if (end_ - current_ < patternLength)
    return false;
  int index = patternLength;
  while (index--)
    if (current_[index] != pattern[index])
      return false;
  current_ += patternLength;
  return true;
}